

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

unsigned_long tjBufSize(int width,int height,int jpegSubsamp)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long *in_FS_OFFSET;
  int chromasf;
  int mcuh;
  int mcuw;
  unsigned_long_long retval;
  int local_28;
  unsigned_long local_18;
  
  if ((((in_EDI < 1) || (in_ESI < 1)) || (in_EDX < 0)) || (5 < in_EDX)) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjBufSize(): Invalid argument");
    local_18 = 0xffffffffffffffff;
  }
  else {
    iVar1 = tjMCUWidth[in_EDX];
    iVar2 = tjMCUHeight[in_EDX];
    if (in_EDX == 3) {
      local_28 = 0;
    }
    else {
      local_28 = (int)(0x100 / (long)(iVar1 * iVar2));
    }
    local_18 = (long)(int)(((in_EDI + iVar1) - 1U & (iVar1 - 1U ^ 0xffffffff)) *
                          ((in_ESI + iVar2) - 1U & (iVar2 - 1U ^ 0xffffffff))) *
               ((long)local_28 + 2) + 0x800;
  }
  return local_18;
}

Assistant:

DLLEXPORT unsigned long tjBufSize(int width, int height, int jpegSubsamp)
{
  unsigned long long retval = 0;
  int mcuw, mcuh, chromasf;

  if (width < 1 || height < 1 || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT)
    THROWG("tjBufSize(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  mcuw = tjMCUWidth[jpegSubsamp];
  mcuh = tjMCUHeight[jpegSubsamp];
  chromasf = jpegSubsamp == TJSAMP_GRAY ? 0 : 4 * 64 / (mcuw * mcuh);
  retval = PAD(width, mcuw) * PAD(height, mcuh) * (2ULL + chromasf) + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSize(): Image is too large");

bailout:
  return (unsigned long)retval;
}